

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_zeroing<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  node_ptr plVar4;
  node_ptr plVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  node_ptr next;
  pointer p;
  _Hash_node_base *p_Var14;
  ulong uVar15;
  pointer p_1;
  pointer p_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_> m;
  shared_count sStack_350;
  char *local_348;
  char *local_340;
  undefined **local_338;
  undefined1 local_330;
  undefined8 *local_328;
  char **local_320;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_318;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 local_1e0 [40];
  __buckets_ptr local_1b8;
  ulong local_1b0;
  __buckets_ptr local_78;
  ulong local_70;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ();
  local_1e0._0_8_ = operator_new(0x38);
  (((Column_settings *)local_1e0._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((Column_settings *)local_1e0._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  (((Column_settings *)local_1e0._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  (((Column_settings *)local_1e0._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  (((Column_settings *)local_1e0._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  (((Column_settings *)local_1e0._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  (((Column_settings *)local_1e0._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
  ::Boundary_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>
              *)(local_1e0 + 8),&local_318,(Column_settings *)local_1e0._0_8_);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x26d);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_70;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (local_78[uVar15 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_78[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var2 = p_Var2->_M_nxt;
      if ((p_Var2 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 != uVar15)) goto LAB_0012eb60;
    }
    if (local_1b8[local_1b0 != 1] != (__node_base_ptr)0x0) {
      p_Var3 = local_1b8[local_1b0 != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x0012e2b4;
    }
  }
  goto LAB_0012eb60;
joined_r0x0012e4d5:
  if (uVar1 == 3) {
    if (local_1b8[local_1b0 != 1] != (__node_base_ptr)0x0) {
      p_Var3 = local_1b8[local_1b0 != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x0012e52c;
    }
    goto LAB_0012eb54;
  }
  p_Var2 = p_Var2->_M_nxt;
  if ((p_Var2 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 != uVar15)) goto LAB_0012eb54;
  goto joined_r0x0012e4d5;
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (uint)((ulong)uVar1 % local_1b0) == (uint)(local_1b0 != 1)))) {
joined_r0x0012e52c:
    if (uVar1 == 1) {
      p_00 = (pointer)(p_Var2 + 5);
      goto LAB_0012e55f;
    }
  }
  goto LAB_0012eb54;
  while( true ) {
    if (p_00 == (pointer)0x0) goto LAB_0012eb84;
    if (p_00->rowIndex_ == *(ID_index *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_0012e55f:
    p_00 = (pointer)(p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p_00 == (pointer)(p_Var2 + 5)) goto LAB_0012e592;
  }
  plVar4 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar5 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar5->next_ = plVar4;
  plVar4->prev_ = plVar5;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Gudhi::
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
  ::destroy((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>
             *)p_Var2[4]._M_nxt,p_00);
LAB_0012e592:
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x270);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_70;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
  if (local_78[uVar15 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_78[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    while (uVar1 != 3) {
      p_Var2 = p_Var2->_M_nxt;
      if ((p_Var2 == (_Hash_node_base *)0x0) ||
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 != uVar15)) goto LAB_0012eb6c;
    }
    if (local_1b8[local_1b0 != 1] != (__node_base_ptr)0x0) {
      p_Var3 = local_1b8[local_1b0 != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x0012e64b;
    }
  }
  goto LAB_0012eb6c;
joined_r0x0012e8fe:
  if (uVar1 == 3) {
    if (local_1b8[local_1b0 != 1] != (__node_base_ptr)0x0) {
      p_Var3 = local_1b8[local_1b0 != 1]->_M_nxt;
      uVar1 = *(uint *)&p_Var3[1]._M_nxt;
      goto joined_r0x0012e955;
    }
    goto LAB_0012eb78;
  }
  p_Var2 = p_Var2->_M_nxt;
  if ((p_Var2 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 != uVar15)) goto LAB_0012eb78;
  goto joined_r0x0012e8fe;
joined_r0x0012e955:
  if (uVar1 == 1) {
    p_Var14 = p_Var2 + 5;
    goto LAB_0012e988;
  }
  p_Var3 = p_Var3->_M_nxt;
  if ((p_Var3 == (_Hash_node_base *)0x0) ||
     (uVar1 = *(uint *)&p_Var3[1]._M_nxt, (uint)((ulong)uVar1 % local_1b0) != (uint)(local_1b0 != 1)
     )) {
LAB_0012eb78:
    std::__throw_out_of_range("_Map_base::at");
  }
  goto joined_r0x0012e955;
  while( true ) {
    if (p_Var14 == (_Hash_node_base *)0x0) goto LAB_0012eb84;
    if (*(int *)&p_Var14[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_0012e2e7:
    p_Var14 = p_Var14->_M_nxt;
    if (p_Var14 == p_Var2 + 5) break;
  }
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_348 = "!m.is_zero_entry(3, 1)";
  local_340 = "";
  local_330 = 0;
  local_338 = &PTR__lazy_ostream_001f2250;
  local_328 = &boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_320 = &local_348;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x26e);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_70;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar7,0);
  if (local_78[uVar15 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_78[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_350.pi_ = (sp_counted_base *)0x0;
        local_348 = "!m.is_zero_column(3)";
        local_340 = "";
        local_330 = 0;
        local_338 = &PTR__lazy_ostream_001f2250;
        local_328 = &boost::unit_test::lazy_ostream::inst;
        local_240 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_238 = "";
        local_320 = &local_348;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_350);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_70;
        uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
        if (local_78[uVar15 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0012eb54;
        p_Var2 = local_78[uVar15 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x0012e4d5;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_Var14 == (_Hash_node_base *)0x0) goto LAB_0012eb84;
    if (*(int *)&p_Var14[2]._M_nxt == *(int *)((long)&p_Var3[1]._M_nxt + 4)) break;
LAB_0012e67e:
    p_Var14 = p_Var14->_M_nxt;
    if (p_Var14 == p_Var2 + 5) break;
  }
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_348 = "m.is_zero_entry(3, 1)";
  local_340 = "";
  local_330 = 0;
  local_338 = &PTR__lazy_ostream_001f2250;
  local_328 = &boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_320 = &local_348;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x271);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_70;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar10,0);
  if (local_78[uVar15 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_78[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_350.pi_ = (sp_counted_base *)0x0;
        local_348 = "!m.is_zero_column(3)";
        local_340 = "";
        local_330 = 0;
        local_338 = &PTR__lazy_ostream_001f2250;
        local_328 = &boost::unit_test::lazy_ostream::inst;
        local_2a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_298 = "";
        local_320 = &local_348;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_350);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_70;
        uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
        if (local_78[uVar15 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0012eb54;
        p_Var2 = local_78[uVar15 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
        goto joined_r0x0012e868;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
LAB_0012e988:
  do {
    p_Var14 = p_Var14->_M_nxt;
    if (p_Var14 == p_Var2 + 5) break;
    if (p_Var14 == (_Hash_node_base *)0x0) {
LAB_0012eb84:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Boundary_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, true>>::Matrix_column_tag, Type = 1]"
                   );
    }
  } while (*(int *)&p_Var14[2]._M_nxt != *(int *)((long)&p_Var3[1]._M_nxt + 4));
  sStack_350.pi_ = (sp_counted_base *)0x0;
  local_348 = "m.is_zero_entry(3, 1)";
  local_340 = "";
  local_330 = 0;
  local_338 = &PTR__lazy_ostream_001f2250;
  local_328 = &boost::unit_test::lazy_ostream::inst;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_320 = &local_348;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_350);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x274);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_70;
  uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar13,0);
  if (local_78[uVar15 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = local_78[uVar15 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        sStack_350.pi_ = (sp_counted_base *)0x0;
        local_348 = "m.is_zero_column(3)";
        local_340 = "";
        local_330 = 0;
        local_338 = &PTR__lazy_ostream_001f2250;
        local_328 = &boost::unit_test::lazy_ostream::inst;
        local_300 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_2f8 = "";
        local_320 = &local_348;
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_350);
        Gudhi::persistence_matrix::
        Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>
        ::~Matrix((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>
                   *)local_1e0);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_318);
        return;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 == uVar15));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (uint)((ulong)uVar1 % local_1b0) == (uint)(local_1b0 != 1)))) {
joined_r0x0012e64b:
    if (uVar1 == 1) {
      p_Var14 = p_Var2 + 5;
      goto LAB_0012e67e;
    }
  }
LAB_0012eb6c:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var2[1]._M_nxt, (ulong)uVar1 % local_70 == uVar15))) {
joined_r0x0012e868:
    if (uVar1 == 3) {
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
      ::
      clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>::Delete_disposer>
                ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                  *)(p_Var2 + 5),
                 (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
                  *)(p_Var2 + 2));
      local_2b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_2a8 = "";
      local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x273);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_70;
      uVar15 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar12,0);
      if (local_78[uVar15 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0012eb78;
      p_Var2 = local_78[uVar15 & 0xffffffff]->_M_nxt;
      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
      goto joined_r0x0012e8fe;
    }
  }
LAB_0012eb54:
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var3 = p_Var3->_M_nxt, p_Var3 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
         (uint)((ulong)uVar1 % local_1b0) == (uint)(local_1b0 != 1)))) {
joined_r0x0012e2b4:
    if (uVar1 == 1) {
      p_Var14 = p_Var2 + 5;
      goto LAB_0012e2e7;
    }
  }
LAB_0012eb60:
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}